

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>
                   (string *__return_storage_ptr__,char (*a) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [16],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [33],static_string_view *args_3)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_228;
  cmAlphaNum local_1f0;
  cmAlphaNum local_1b8;
  cmAlphaNum local_180;
  cmAlphaNum local_148;
  cmAlphaNum local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [33];
  char (*args_local_2) [33];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [7];
  
  local_38 = args_2;
  args_local_2 = (char (*) [33])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [16])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [7])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_110,*a);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_d8,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_110);
  cmAlphaNum::cmAlphaNum(&local_148,(string *)args_local);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_148);
  cmAlphaNum::cmAlphaNum(&local_180,(char *)args_local_1);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_180);
  cmAlphaNum::cmAlphaNum(&local_1b8,(string *)args_local_2);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_1b8);
  cmAlphaNum::cmAlphaNum(&local_1f0,*local_38);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_1f0);
  cmAlphaNum::cmAlphaNum(&local_228,args_3->super_string_view);
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[16],std::__cxx11::string&,char_const(&)[33],cm::static_string_view>(char_const&[],std::__cxx11::string_const&,char_const&[],std::__cxx11::string&,char_const&[],cm::static_string_view&&)
              ::makePair,&local_228);
  local_48 = &local_d8;
  local_40 = 6;
  views._M_len = 6;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}